

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

SequenceMatchListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::SequenceMatchListSyntax,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>const&>
          (BumpAllocator *this,Token *args,
          SeparatedSyntaxList<slang::syntax::PropertyExprSyntax> *args_1)

{
  Token comma;
  SequenceMatchListSyntax *this_00;
  
  this_00 = (SequenceMatchListSyntax *)allocate(this,0x50,8);
  comma.kind = args->kind;
  comma._2_1_ = args->field_0x2;
  comma.numFlags.raw = (args->numFlags).raw;
  comma.rawLen = args->rawLen;
  comma.info = args->info;
  slang::syntax::SequenceMatchListSyntax::SequenceMatchListSyntax(this_00,comma,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }